

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

z_uLong z_deflateBound(z_streamp strm,z_uLong sourceLen)

{
  z_uLong destLen;
  deflate_state *s;
  z_uLong sourceLen_local;
  z_streamp strm_local;
  
  strm_local._4_4_ = sourceLen + (sourceLen + 7 >> 3) + (sourceLen + 0x3f >> 6) + 0xb;
  if ((((strm != (z_streamp)0x0) && (strm->state != (internal_state *)0x0)) &&
      (strm->state->w_bits == 0xf)) && (strm->state->hash_bits == 0xf)) {
    strm_local._4_4_ = z_compressBound(sourceLen);
  }
  return strm_local._4_4_;
}

Assistant:

uLong ZEXPORT deflateBound(strm, sourceLen)
    z_streamp strm;
    uLong sourceLen;
{
    deflate_state *s;
    uLong destLen;

    /* conservative upper bound */
    destLen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 11;

    /* if can't get parameters, return conservative bound */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return destLen;

    /* if not default parameters, return conservative bound */
    s = strm->state;
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return destLen;

    /* default settings: return tight bound for that case */
    return compressBound(sourceLen);
}